

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber * decTrim(decNumber *dn,decContext *set,uint8_t all,uint8_t noclamp,int32_t *dropped)

{
  bool bVar1;
  int iVar2;
  int shift;
  uint units;
  uint8_t *puVar3;
  int iVar4;
  
  *dropped = 0;
  if (((dn->bits & 0x70) == 0) && ((dn->lsu[0] & 1) == 0)) {
    if ((dn->lsu[0] == 0) && (dn->digits == 1)) {
      dn->exponent = 0;
    }
    else {
      units = dn->digits;
      shift = 0;
      if (1 < (long)(int)units) {
        iVar2 = 0;
        puVar3 = dn->lsu;
        iVar4 = dn->exponent;
        do {
          if (((uint)(*puVar3 >> 1) * 0x6667 >> 0x10 & 0xfffffffe) * 5 == (uint)*puVar3) {
            if (iVar4 < 1 && all == '\0') {
              if (iVar4 == 0) {
                iVar4 = 0;
                goto LAB_0024a82e;
              }
              iVar4 = iVar4 + 1;
            }
            puVar3 = puVar3 + 1;
            bVar1 = true;
          }
          else {
LAB_0024a82e:
            bVar1 = false;
          }
          shift = iVar2;
        } while ((bVar1) && (iVar2 = iVar2 + 1, shift = units - 1, units - 1 != iVar2));
      }
      if (shift != 0) {
        if ((noclamp == '\0') && (set->clamp != '\0')) {
          iVar2 = (set->emax - (dn->exponent + set->digits)) + 1;
          iVar4 = iVar2;
          if (shift < iVar2) {
            iVar4 = shift;
          }
          shift = iVar4;
          if (iVar2 < 1) {
            return dn;
          }
        }
        if ((int)units < 0x32) {
          units = (uint)""[(int)units];
        }
        decShiftToLeast(dn->lsu,units,shift);
        dn->exponent = dn->exponent + shift;
        dn->digits = dn->digits - shift;
        *dropped = shift;
      }
    }
  }
  return dn;
}

Assistant:

static decNumber * decTrim(decNumber *dn, decContext *set, Flag all,
                           Flag noclamp, Int *dropped) {
  Int   d, exp;                    /* work  */
  uInt  cut;                       /* ..  */
  Unit  *up;                       /* -> current Unit  */

  #if DECCHECK
  if (decCheckOperands(dn, DECUNUSED, DECUNUSED, DECUNCONT)) return dn;
  #endif

  *dropped=0;                           /* assume no zeros dropped  */
  if ((dn->bits & DECSPECIAL)           /* fast exit if special ..  */
    || (*dn->lsu & 0x01)) return dn;    /* .. or odd  */
  if (ISZERO(dn)) {                     /* .. or 0  */
    dn->exponent=0;                     /* (sign is preserved)  */
    return dn;
    }

  /* have a finite number which is even  */
  exp=dn->exponent;
  cut=1;                           /* digit (1-DECDPUN) in Unit  */
  up=dn->lsu;                      /* -> current Unit  */
  for (d=0; d<dn->digits-1; d++) { /* [don't strip the final digit]  */
    /* slice by powers  */
    #if DECDPUN<=4
      uInt quot=QUOT10(*up, cut);
      if ((*up-quot*powers[cut])!=0) break;  /* found non-0 digit  */
    #else
      if (*up%powers[cut]!=0) break;         /* found non-0 digit  */
    #endif
    /* have a trailing 0  */
    if (!all) {                    /* trimming  */
      /* [if exp>0 then all trailing 0s are significant for trim]  */
      if (exp<=0) {                /* if digit might be significant  */
        if (exp==0) break;         /* then quit  */
        exp++;                     /* next digit might be significant  */
        }
      }
    cut++;                         /* next power  */
    if (cut>DECDPUN) {             /* need new Unit  */
      up++;
      cut=1;
      }
    } /* d  */
  if (d==0) return dn;             /* none to drop  */

  /* may need to limit drop if clamping  */
  if (set->clamp && !noclamp) {
    Int maxd=set->emax-set->digits+1-dn->exponent;
    if (maxd<=0) return dn;        /* nothing possible  */
    if (d>maxd) d=maxd;
    }

  /* effect the drop  */
  decShiftToLeast(dn->lsu, D2U(dn->digits), d);
  dn->exponent+=d;                 /* maintain numerical value  */
  dn->digits-=d;                   /* new length  */
  *dropped=d;                      /* report the count  */
  return dn;
  }